

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd8.c
# Opt level: O1

CTX_PTR CreateSuccessors(CPpmd8 *p,Bool skip,CPpmd_State *s1,CTX_PTR c)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  CPpmd_State *pCVar5;
  Byte *pBVar6;
  bool bVar7;
  byte *pbVar8;
  CTX_PTR pCVar9;
  ulong uVar10;
  CPpmd_State *pCVar11;
  byte *pbVar12;
  uint uVar13;
  char cVar14;
  CTX_PTR in_R10;
  int iVar15;
  ulong uVar16;
  CPpmd_State *ps [17];
  CTX_PTR local_c8;
  CPpmd_State *local_b8 [17];
  
  pCVar5 = p->FoundState;
  uVar4 = *(uint *)&pCVar5->SuccessorLow;
  uVar16 = 0;
  if (skip == 0) {
    local_b8[0] = pCVar5;
    uVar16 = 1;
  }
  do {
    if ((ulong)c->Suffix == 0) goto LAB_005cbf98;
    pBVar6 = p->Base;
    c = (CTX_PTR)(pBVar6 + c->Suffix);
    if (s1 == (CPpmd_State *)0x0) {
      if (c->NumStats == '\0') {
        s1 = (CPpmd_State *)&c->SummFreq;
        bVar1 = *(byte *)((long)&c->SummFreq + 1);
        *(byte *)((long)&c->SummFreq + 1) = (bVar1 < 0x18 && pBVar6[c->Suffix] == '\0') + bVar1;
      }
      else {
        s1 = (CPpmd_State *)(pBVar6 + ((ulong)c->Stats - 6));
        do {
          pCVar11 = s1;
          s1 = pCVar11 + 1;
        } while ((Byte)*(CPpmd8_Context_Ref *)&pCVar11[1].Symbol != pCVar5->Symbol);
        if (pCVar11[1].Freq < 0x73) {
          pCVar11[1].Freq = pCVar11[1].Freq + 1;
          c->SummFreq = c->SummFreq + 1;
        }
      }
    }
    iVar15 = (int)uVar16;
    if (*(uint *)&s1->SuccessorLow == uVar4) {
      local_b8[uVar16] = s1;
      cVar14 = '\0';
      uVar16 = (ulong)(iVar15 + 1);
    }
    else {
      c = (CTX_PTR)(pBVar6 + *(uint *)&s1->SuccessorLow);
      cVar14 = (iVar15 != 0) * '\x02' + '\x01';
      if (iVar15 == 0) {
        in_R10 = c;
      }
    }
    s1 = (CPpmd_State *)0x0;
  } while (cVar14 == '\0');
  if (cVar14 == '\x03') {
LAB_005cbf98:
    bVar1 = pCVar5->Symbol;
    bVar2 = p->Base[uVar4];
    if (c->NumStats == 0) {
      cVar14 = *(char *)((long)&c->SummFreq + 1);
    }
    else {
      pbVar8 = p->Base + c->Stats;
      do {
        pbVar12 = pbVar8;
        pbVar8 = pbVar12 + 6;
      } while (*pbVar12 != bVar2);
      bVar3 = pbVar12[1];
      uVar13 = ((uint)c->SummFreq - ((uint)c->NumStats + (uint)bVar3)) + 1;
      if (uVar13 < (uint)bVar3 * 2 - 2) {
        cVar14 = (char)((((uint)bVar3 + uVar13 * 2) - 4) / uVar13);
      }
      else {
        cVar14 = uVar13 < (bVar3 - 1) * 5;
      }
      cVar14 = cVar14 + '\x01';
    }
    local_c8 = in_R10;
    do {
      if (p->HiUnit == p->LoUnit) {
        uVar10 = (ulong)p->FreeList[0];
        if (uVar10 != 0) {
          pCVar9 = (CTX_PTR)(p->Base + uVar10);
          p->FreeList[0] = *(CPpmd_Void_Ref *)(p->Base + uVar10 + 4);
          p->Stamps[0] = p->Stamps[0] - 1;
          goto LAB_005cc08f;
        }
        bVar7 = false;
        pCVar9 = (CTX_PTR)AllocUnitsRare(p,0);
        if (pCVar9 != (CTX_PTR)0x0) goto LAB_005cc08f;
        local_c8 = (CTX_PTR)0x0;
      }
      else {
        pCVar9 = (CTX_PTR)(p->HiUnit + -0xc);
        p->HiUnit = (Byte *)pCVar9;
LAB_005cc08f:
        pCVar9->NumStats = '\0';
        pCVar9->Flags = (0x3f < bVar1) << 4 | (0x3f < bVar2) << 3;
        *(byte *)&pCVar9->SummFreq = bVar2;
        *(char *)((long)&pCVar9->SummFreq + 1) = cVar14;
        pCVar9->Stats = uVar4 + 1;
        iVar15 = *(int *)&p->Base;
        pCVar9->Suffix = (int)c - iVar15;
        uVar16 = (ulong)((int)uVar16 - 1);
        *(int *)&local_b8[uVar16]->SuccessorLow = (int)pCVar9 - iVar15;
        bVar7 = true;
        c = pCVar9;
      }
      in_R10 = local_c8;
    } while ((bVar7) && (in_R10 = c, (int)uVar16 != 0));
  }
  return in_R10;
}

Assistant:

static CTX_PTR CreateSuccessors(CPpmd8 *p, Bool skip, CPpmd_State *s1, CTX_PTR c)
{
  CPpmd_State upState;
  Byte flags;
  CPpmd_Byte_Ref upBranch = (CPpmd_Byte_Ref)SUCCESSOR(p->FoundState);
  /* fixed over Shkarin's code. Maybe it could work without + 1 too. */
  CPpmd_State *ps[PPMD8_MAX_ORDER + 1];
  unsigned numPs = 0;
  
  if (!skip)
    ps[numPs++] = p->FoundState;
  
  while (c->Suffix)
  {
    CPpmd_Void_Ref successor;
    CPpmd_State *s;
    c = SUFFIX(c);
    if (s1)
    {
      s = s1;
      s1 = NULL;
    }
    else if (c->NumStats != 0)
    {
      for (s = STATS(c); s->Symbol != p->FoundState->Symbol; s++);
      if (s->Freq < MAX_FREQ - 9)
      {
        s->Freq++;
        c->SummFreq++;
      }
    }
    else
    {
      s = ONE_STATE(c);
      s->Freq = (Byte)(s->Freq + (!SUFFIX(c)->NumStats & (s->Freq < 24)));
    }
    successor = SUCCESSOR(s);
    if (successor != upBranch)
    {
      c = CTX(successor);
      if (numPs == 0)
        return c;
      break;
    }
    ps[numPs++] = s;
  }
  
  upState.Symbol = *(const Byte *)Ppmd8_GetPtr(p, upBranch);
  SetSuccessor(&upState, upBranch + 1);
  flags = (Byte)(0x10 * (p->FoundState->Symbol >= 0x40) + 0x08 * (upState.Symbol >= 0x40));

  if (c->NumStats == 0)
    upState.Freq = ONE_STATE(c)->Freq;
  else
  {
    UInt32 cf, s0;
    CPpmd_State *s;
    for (s = STATS(c); s->Symbol != upState.Symbol; s++);
    cf = s->Freq - 1;
    s0 = c->SummFreq - c->NumStats - cf;
    upState.Freq = (Byte)(1 + ((2 * cf <= s0) ? (5 * cf > s0) : ((cf + 2 * s0 - 3) / s0)));
  }

  do
  {
    /* Create Child */
    CTX_PTR c1; /* = AllocContext(p); */
    if (p->HiUnit != p->LoUnit)
      c1 = (CTX_PTR)(p->HiUnit -= UNIT_SIZE);
    else if (p->FreeList[0] != 0)
      c1 = (CTX_PTR)RemoveNode(p, 0);
    else
    {
      c1 = (CTX_PTR)AllocUnitsRare(p, 0);
      if (!c1)
        return NULL;
    }
    c1->NumStats = 0;
    c1->Flags = flags;
    *ONE_STATE(c1) = upState;
    c1->Suffix = REF(c);
    SetSuccessor(ps[--numPs], REF(c1));
    c = c1;
  }
  while (numPs != 0);
  
  return c;
}